

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoalesceLocals.cpp
# Opt level: O0

void __thiscall
wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<unsigned_int,std::
allocator<unsigned_int>>&)::Generator::calculateFitness(wasm::CoalesceLocalsWithLearning::
pickIndices(std::vector<unsigned_int,std::allocator<unsigned_int>>&)::Order__
          (void *this,Order *order)

{
  uint uVar1;
  iterator __first;
  iterator __last;
  reference puVar2;
  reference pvVar3;
  uint local_74;
  Index i;
  double fragment;
  double fitness;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  uint local_48;
  uint maxIndex;
  uint local_34;
  undefined1 local_30 [4];
  Index removedCopies;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  Order *order_local;
  Generator *this_local;
  
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)order;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  CoalesceLocals::pickIndicesFromOrder
            (*this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,&local_34);
  __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  local_50 = std::
             max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (__first._M_current,__last._M_current);
  puVar2 = __gnu_cxx::
           __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           ::operator*(&local_50);
  local_48 = *puVar2;
  if (local_48 <= *(uint *)(*this + 0x288)) {
    fragment = (double)(*(int *)(*this + 0x288) - local_48);
    uVar1 = *(uint *)(*this + 0x288);
    for (local_74 = 0; local_74 < *(uint *)(*this + 0x288); local_74 = local_74 + 1) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_74);
      if (*pvVar3 == local_74) {
        fragment = 1.0 / ((double)uVar1 * 2.0) + fragment;
      }
    }
    pickIndices::Order::setFitness
              ((Order *)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
               fragment * 100.0 + (double)local_34);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
    return;
  }
  __assert_fail("maxIndex <= parent->numLocals",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/CoalesceLocals.cpp"
                ,0x282,
                "void wasm::CoalesceLocalsWithLearning::pickIndices(std::vector<Index> &)::Generator::calculateFitness(Order *)"
               );
}

Assistant:

void calculateFitness(Order* order) {
      // apply the order
      std::vector<Index> indices; // the phenotype
      Index removedCopies;
      parent->pickIndicesFromOrder(*order, indices, removedCopies);
      auto maxIndex = *std::max_element(indices.begin(), indices.end());
      assert(maxIndex <= parent->numLocals);
      // main part of fitness is the number of locals
      double fitness = parent->numLocals - maxIndex; // higher fitness is better
      // secondarily, it is nice to not reorder locals unnecessarily
      double fragment = 1.0 / (2.0 * parent->numLocals);
      for (Index i = 0; i < parent->numLocals; i++) {
        if ((*order)[i] == i) {
          fitness += fragment; // boost for each that wasn't moved
        }
      }
      // removing copies is a secondary concern
      fitness = (100 * fitness) + removedCopies;
      order->setFitness(fitness);
    }